

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_common.c
# Opt level: O0

void jpegd_write_qp_ac_dc_table(JpegdHalCtx *ctx,JpegdSyntax *syntax)

{
  uint uVar1;
  uint local_a0;
  uint local_9c;
  RK_U32 j;
  RK_U32 i;
  DcTable *dc_ptr1;
  DcTable *dc_ptr0;
  AcTable *ac_ptr1;
  AcTable *ac_ptr0;
  RK_U32 shifter;
  RK_U32 table_value;
  RK_U32 table_word;
  RK_U32 idx;
  RK_U8 table_tmp [64];
  RK_U32 *base;
  JpegdSyntax *s;
  JpegdSyntax *syntax_local;
  JpegdHalCtx *ctx_local;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_COMMON","enter\n","jpegd_write_qp_ac_dc_table");
  }
  table_tmp._56_8_ = mpp_buffer_get_ptr_with_caller(ctx->pTableBase,"jpegd_write_qp_ac_dc_table");
  memset(&table_word,0,0x40);
  shifter = 0;
  ac_ptr0._0_4_ = 0x20;
  for (local_a0 = 0; local_a0 < syntax->qtable_cnt; local_a0 = local_a0 + 1) {
    uVar1 = syntax->quant_index[local_a0];
    for (local_9c = 0; local_9c < 0x40; local_9c = local_9c + 1) {
      *(char *)((long)&table_word + (ulong)""[local_9c]) =
           (char)syntax->quant_matrixes[uVar1][local_9c];
    }
    for (local_9c = 0; local_9c < 0x40; local_9c = local_9c + 4) {
      shifter = (uint)*(byte *)((long)&table_word + (ulong)local_9c) << 0x18 |
                (uint)*(byte *)((long)&table_word + (ulong)(local_9c + 1)) << 0x10 |
                (uint)*(byte *)((long)&table_word + (ulong)(local_9c + 2)) << 8 |
                (uint)*(byte *)((long)&table_word + (ulong)(local_9c + 3));
      *(RK_U32 *)table_tmp._56_8_ = shifter;
      table_tmp._56_8_ = table_tmp._56_8_ + 4;
    }
  }
  if (syntax->ac_index[0] == 0) {
    ac_ptr1 = syntax->ac_table;
    dc_ptr0 = (DcTable *)(syntax->ac_table + 1);
  }
  else {
    ac_ptr1 = syntax->ac_table + 1;
    dc_ptr0 = (DcTable *)syntax->ac_table;
  }
  for (local_9c = 0; local_9c < 0xa2; local_9c = local_9c + 1) {
    if (local_9c < ac_ptr1->actual_length) {
      ac_ptr0._4_4_ = ac_ptr1->vals[local_9c] & 0xff;
    }
    else {
      ac_ptr0._4_4_ = 0;
    }
    if ((int)ac_ptr0 == 0x20) {
      shifter = ac_ptr0._4_4_ << ((char)(int)ac_ptr0 - 8U & 0x1f);
    }
    else {
      shifter = ac_ptr0._4_4_ << ((char)(int)ac_ptr0 - 8U & 0x1f) | shifter;
    }
    ac_ptr0._0_4_ = (int)ac_ptr0 + -8;
    if ((int)ac_ptr0 == 0) {
      *(RK_U32 *)table_tmp._56_8_ = shifter;
      table_tmp._56_8_ = table_tmp._56_8_ + 4;
      ac_ptr0._0_4_ = 0x20;
    }
  }
  for (local_9c = 0; local_9c < 0xa2; local_9c = local_9c + 1) {
    if ((syntax->yuv_mode == 0) || (dc_ptr0[6].bits[4] <= local_9c)) {
      ac_ptr0._4_4_ = 0;
    }
    else {
      ac_ptr0._4_4_ = dc_ptr0->vals[local_9c] & 0xff;
    }
    if ((int)ac_ptr0 == 0x20) {
      shifter = ac_ptr0._4_4_ << ((char)(int)ac_ptr0 - 8U & 0x1f);
    }
    else {
      shifter = ac_ptr0._4_4_ << ((char)(int)ac_ptr0 - 8U & 0x1f) | shifter;
    }
    ac_ptr0._0_4_ = (int)ac_ptr0 + -8;
    if ((int)ac_ptr0 == 0) {
      *(RK_U32 *)table_tmp._56_8_ = shifter;
      table_tmp._56_8_ = table_tmp._56_8_ + 4;
      ac_ptr0._0_4_ = 0x20;
    }
  }
  if (syntax->dc_index[0] == 0) {
    dc_ptr1 = syntax->dc_table;
    _j = syntax->dc_table + 1;
  }
  else {
    dc_ptr1 = syntax->dc_table + 1;
    _j = syntax->dc_table;
  }
  for (local_9c = 0; local_9c < 0xc; local_9c = local_9c + 1) {
    if (local_9c < dc_ptr1->actual_length) {
      ac_ptr0._4_4_ = dc_ptr1->vals[local_9c] & 0xff;
    }
    else {
      ac_ptr0._4_4_ = 0;
    }
    if ((int)ac_ptr0 == 0x20) {
      shifter = ac_ptr0._4_4_ << ((char)(int)ac_ptr0 - 8U & 0x1f);
    }
    else {
      shifter = ac_ptr0._4_4_ << ((char)(int)ac_ptr0 - 8U & 0x1f) | shifter;
    }
    ac_ptr0._0_4_ = (int)ac_ptr0 + -8;
    if ((int)ac_ptr0 == 0) {
      *(RK_U32 *)table_tmp._56_8_ = shifter;
      table_tmp._56_8_ = table_tmp._56_8_ + 4;
      ac_ptr0._0_4_ = 0x20;
    }
  }
  for (local_9c = 0; local_9c < 0xc; local_9c = local_9c + 1) {
    if ((syntax->yuv_mode == 0) || (_j->actual_length <= local_9c)) {
      ac_ptr0._4_4_ = 0;
    }
    else {
      ac_ptr0._4_4_ = _j->vals[local_9c] & 0xff;
    }
    if ((int)ac_ptr0 == 0x20) {
      shifter = ac_ptr0._4_4_ << ((char)(int)ac_ptr0 - 8U & 0x1f);
    }
    else {
      shifter = ac_ptr0._4_4_ << ((char)(int)ac_ptr0 - 8U & 0x1f) | shifter;
    }
    ac_ptr0._0_4_ = (int)ac_ptr0 + -8;
    if ((int)ac_ptr0 == 0) {
      *(RK_U32 *)table_tmp._56_8_ = shifter;
      table_tmp._56_8_ = table_tmp._56_8_ + 4;
      ac_ptr0._0_4_ = 0x20;
    }
  }
  for (local_9c = 0; local_9c < 4; local_9c = local_9c + 1) {
    if ((int)ac_ptr0 == 0x20) {
      shifter = 0 << ((char)(int)ac_ptr0 - 8U & 0x1f);
    }
    else {
      shifter = 0 << ((char)(int)ac_ptr0 - 8U & 0x1f) | shifter;
    }
    ac_ptr0._0_4_ = (int)ac_ptr0 + -8;
    if ((int)ac_ptr0 == 0) {
      *(RK_U32 *)table_tmp._56_8_ = shifter;
      table_tmp._56_8_ = table_tmp._56_8_ + 4;
      ac_ptr0._0_4_ = 0x20;
    }
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_COMMON","exit\n","jpegd_write_qp_ac_dc_table");
  }
  return;
}

Assistant:

void jpegd_write_qp_ac_dc_table(JpegdHalCtx *ctx,
                                JpegdSyntax*syntax)
{
    jpegd_dbg_func("enter\n");
    JpegdSyntax *s = syntax;
    RK_U32 *base = (RK_U32 *)mpp_buffer_get_ptr(ctx->pTableBase);
    RK_U8 table_tmp[QUANTIZE_TABLE_LENGTH] = {0};
    RK_U32 idx, table_word = 0, table_value = 0;
    RK_U32 shifter = 32;
    AcTable *ac_ptr0 = NULL, *ac_ptr1 = NULL;
    DcTable *dc_ptr0 = NULL, *dc_ptr1 = NULL;
    RK_U32 i, j = 0;

    /* Quantize tables for all components
     * length = 64 * 3  (Bytes)
     */
    for (j = 0; j < s->qtable_cnt; j++) {
        idx = s->quant_index[j]; /* quantize table index used by j component */

        for (i = 0; i < QUANTIZE_TABLE_LENGTH; i++) {
            table_tmp[zzOrder[i]] = (RK_U8) s->quant_matrixes[idx][i];
        }

        /* could memcpy be OK?? */
        for (i = 0; i < QUANTIZE_TABLE_LENGTH; i += 4) {
            /* transfer to big endian */
            table_word = (table_tmp[i] << 24) |
                         (table_tmp[i + 1] << 16) |
                         (table_tmp[i + 2] << 8) |
                         table_tmp[i + 3];
            *base = table_word;
            base++;
        }
    }

    /* write AC and DC tables
     * memory:  AC(Y) - AC(UV) - DC(Y) - DC(UV)
     * length = 162   + 162    + 12    + 12   (Bytes)
     */
    {
        /* this trick is done because hardware always wants
         * luma table as ac hardware table 0 */
        if (s->ac_index[0] == HUFFMAN_TABLE_ID_ZERO) {
            /* Luma's AC uses Huffman table zero */
            ac_ptr0 = &(s->ac_table[HUFFMAN_TABLE_ID_ZERO]);
            ac_ptr1 = &(s->ac_table[HUFFMAN_TABLE_ID_ONE]);
        } else {
            ac_ptr0 = &(s->ac_table[HUFFMAN_TABLE_ID_ONE]);
            ac_ptr1 = &(s->ac_table[HUFFMAN_TABLE_ID_ZERO]);
        }

        /* write luma AC table */
        for (i = 0; i < MAX_AC_HUFFMAN_TABLE_LENGTH; i++) {
            if (i < ac_ptr0->actual_length)
                table_value = (RK_U8) ac_ptr0->vals[i];
            else
                table_value = 0;

            /* transfer to big endian */
            if (shifter == 32)
                table_word = (table_value << (shifter - 8));
            else
                table_word |= (table_value << (shifter - 8));

            shifter -= 8;
            if (shifter == 0) {
                /* write 4 Bytes(32 bit) */
                *base = table_word;
                base++;
                shifter = 32;
            }
        }

        /* write chroma AC table */
        for (i = 0; i < MAX_AC_HUFFMAN_TABLE_LENGTH; i++) {
            /* chroma's AC table must be zero for YUV400 */
            if ((s->yuv_mode != JPEGDEC_YUV400) && (i < ac_ptr1->actual_length))
                table_value = (RK_U8) ac_ptr1->vals[i];
            else
                table_value = 0;

            /* transfer to big endian */
            if (shifter == 32)
                table_word = (table_value << (shifter - 8));
            else
                table_word |= (table_value << (shifter - 8));

            shifter -= 8;
            if (shifter == 0) {
                /* write 4 Bytes(32 bit) */
                *base = table_word;
                base++;
                shifter = 32;
            }
        }

        /* this trick is done because hardware always wants
         * luma table as dc hardware table 0 */
        if (s->dc_index[0] == HUFFMAN_TABLE_ID_ZERO) {
            /* Luma's DC uses Huffman table zero */
            dc_ptr0 = &(s->dc_table[HUFFMAN_TABLE_ID_ZERO]);
            dc_ptr1 = &(s->dc_table[HUFFMAN_TABLE_ID_ONE]);
        } else {
            dc_ptr0 = &(s->dc_table[HUFFMAN_TABLE_ID_ONE]);
            dc_ptr1 = &(s->dc_table[HUFFMAN_TABLE_ID_ZERO]);
        }

        /* write luma DC table */
        for (i = 0; i < MAX_DC_HUFFMAN_TABLE_LENGTH; i++) {
            if (i < dc_ptr0->actual_length)
                table_value = (RK_U8) dc_ptr0->vals[i];
            else
                table_value = 0;

            /* transfer to big endian */
            if (shifter == 32)
                table_word = (table_value << (shifter - 8));
            else
                table_word |= (table_value << (shifter - 8));

            shifter -= 8;
            if (shifter == 0) {
                /* write 4 Bytes(32 bit) */
                *base = table_word;
                base++;
                shifter = 32;
            }
        }

        /* write chroma DC table */
        for (i = 0; i < MAX_DC_HUFFMAN_TABLE_LENGTH; i++) {
            /* chroma's DC table must be zero for YUV400 */
            if ((s->yuv_mode != JPEGDEC_YUV400) && (i < dc_ptr1->actual_length))
                table_value = (RK_U8) dc_ptr1->vals[i];
            else
                table_value = 0;

            /* transfer to big endian */
            if (shifter == 32)
                table_word = (table_value << (shifter - 8));
            else
                table_word |= (table_value << (shifter - 8));

            shifter -= 8;
            if (shifter == 0) {
                /* write 4 Bytes(32 bit) */
                *base = table_word;
                base++;
                shifter = 32;
            }
        }
    }

    /* four-byte padding zero */
    for (i = 0; i < 4; i++) {
        table_value = 0;

        if (shifter == 32)
            table_word = (table_value << (shifter - 8));
        else
            table_word |= (table_value << (shifter - 8));

        shifter -= 8;

        if (shifter == 0) {
            *base = table_word;
            base++;
            shifter = 32;
        }
    }
    jpegd_dbg_func("exit\n");
    return;
}